

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PCMSegment.hpp
# Opt level: O2

void __thiscall
Storage::Disk::PCMSegment::PCMSegment(PCMSegment *this,size_t number_of_bits,uint8_t *source)

{
  size_t c;
  ulong __n;
  reference rVar1;
  allocator_type local_2a;
  bool local_29;
  
  (this->length_of_a_bit).length = 1;
  (this->length_of_a_bit).clock_rate = 1;
  local_29 = false;
  std::vector<bool,_std::allocator<bool>_>::vector(&this->data,number_of_bits,&local_29,&local_2a);
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_start.super__Bit_iterator_base._M_offset = 0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_finish.super__Bit_iterator_base._M_offset = 0;
  (this->fuzzy_mask).super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
  _M_end_of_storage = (_Bit_pointer)0x0;
  for (__n = 0; number_of_bits != __n; __n = __n + 1) {
    if ((source[__n >> 3] >> (~(byte)__n & 7) & 1) != 0) {
      rVar1 = std::vector<bool,_std::allocator<bool>_>::operator[](&this->data,__n);
      *rVar1._M_p = *rVar1._M_p | rVar1._M_mask;
    }
  }
  return;
}

Assistant:

PCMSegment(size_t number_of_bits, const uint8_t *source)
		: data(number_of_bits, false) {
		for(size_t c = 0; c < number_of_bits; ++c) {
			if((source[c >> 3] >> (7 ^ (c & 7)))&1) {
				data[c] = true;
			}
		}
	}